

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

void new_anything(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _glist *canvas;
  
  if (1000 < tryingalready) {
    pd_error((void *)0x0,"maximum object loading depth %d reached",1000);
    return;
  }
  if (s != &s_anything) {
    pd_maininstance.pd_newest = (t_pd *)0x0;
    class_loadsym = s;
    pd_globallock();
    canvas = canvas_getcurrent();
    iVar1 = sys_load_lib(canvas,s->s_name);
    if (iVar1 != 0) {
      tryingalready = tryingalready + 1;
      pd_typedmess((t_pd *)dummy,s,argc,argv);
      tryingalready = tryingalready + -1;
      return;
    }
    class_loadsym = (t_symbol *)0x0;
    pd_globalunlock();
    return;
  }
  pd_error((void *)0x0,"object name \"%s\" not allowed",s_anything.s_name);
  return;
}

Assistant:

void new_anything(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int fd;
    char dirbuf[MAXPDSTRING], classslashclass[MAXPDSTRING], *nameptr;
    if (tryingalready>MAXOBJDEPTH){
      pd_error(0, "maximum object loading depth %d reached", MAXOBJDEPTH);
      return;
    }
    if (s == &s_anything){
      pd_error(0, "object name \"%s\" not allowed", s->s_name);
      return;
    }
    pd_this->pd_newest = 0;
    class_loadsym = s;
    pd_globallock();
    if (sys_load_lib(canvas_getcurrent(), s->s_name))
    {
        tryingalready++;
        typedmess(dummy, s, argc, argv);
        tryingalready--;
        return;
    }
    class_loadsym = 0;
    pd_globalunlock();
}